

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_obj_id_t CVmObjFileName::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  char *pcVar2;
  uint in_ESI;
  char buf [4096];
  int32_t sfid;
  char *pwd;
  vm_obj_id_t id;
  char *file;
  char *path;
  vm_val_t *in_stack_ffffffffffffef88;
  vm_val_t *in_stack_ffffffffffffef90;
  vm_val_t *in_stack_ffffffffffffef98;
  undefined8 in_stack_ffffffffffffefa0;
  int32_t sfid_00;
  char local_1038 [220];
  int in_stack_fffffffffffff0a4;
  size_t in_stack_fffffffffffff0a8;
  char *in_stack_fffffffffffff0b0;
  size_t in_stack_fffffffffffff0b8;
  char *in_stack_fffffffffffff0c0;
  int32_t in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  vm_obj_id_t local_24;
  
  sfid_00 = (int32_t)((ulong)in_stack_ffffffffffffefa0 >> 0x20);
  if (in_ESI == 0) {
    pcVar2 = fn_pwd_dir();
    strlen(pcVar2);
    local_24 = create_from_local((char *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88
                                );
LAB_002e9321:
    CVmStack::discard(in_ESI);
    return local_24;
  }
  if (in_ESI == 1) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffef88);
    if (pcVar2 != (char *)0x0) {
      vmb_get_len((char *)0x2e9192);
      local_24 = create_from_local((char *)in_stack_ffffffffffffef90,
                                   (size_t)in_stack_ffffffffffffef88);
      goto LAB_002e9321;
    }
  }
  if (in_ESI == 1) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_numeric(in_stack_ffffffffffffef90);
    if (iVar1 != 0) {
      CVmStack::get(0);
      vm_val_t::num_to_int(in_stack_ffffffffffffef90);
      iVar1 = CVmObjFile::sfid_to_path
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      if (iVar1 == 0) {
        err_throw(0);
      }
      strlen(local_1038);
      local_24 = create_from_sfid(sfid_00,(char *)in_stack_ffffffffffffef98,
                                  (size_t)in_stack_ffffffffffffef90);
      goto LAB_002e9321;
    }
  }
  if (in_ESI == 2) {
    CVmStack::get(0);
    pcVar2 = get_local_path(in_stack_ffffffffffffef98);
    if (pcVar2 != (char *)0x0) {
      CVmStack::get(1);
      pcVar2 = get_local_path(in_stack_ffffffffffffef98);
      if (pcVar2 != (char *)0x0) {
        vmb_get_len((char *)0x2e92b7);
        vmb_get_len((char *)0x2e92da);
        local_24 = combine_path(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,
                                in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                                in_stack_fffffffffffff0a4);
        goto LAB_002e9321;
      }
    }
  }
  if (in_ESI < 3) {
    err_throw(0);
  }
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* parse arguments */
    const char *path, *file;
    vm_obj_id_t id = VM_INVALID_OBJ;
    if (argc == 0)
    {
        /* no arguments - create a file representing the working directory */
        const char *pwd = fn_pwd_dir(vmg0_);
        id = create_from_local(vmg_ pwd, strlen(pwd));
    }
    else if (argc == 1 && (file = G_stk->get(0)->get_as_string(vmg0_)) != 0)
    {
        /* it's a string in local filename notation */
        id = create_from_local(vmg_ file + VMB_LEN, vmb_get_len(file));
    }
    else if (argc == 1 && G_stk->get(0)->is_numeric(vmg0_))
    {
        /* it's a special file ID - resolve to a path */
        int32_t sfid = G_stk->get(0)->num_to_int(vmg0_);
        char buf[OSFNMAX];
        if (!CVmObjFile::sfid_to_path(vmg_ buf, sizeof(buf), sfid))
            err_throw(VMERR_BAD_VAL_BIF);

        /* create the file */
        id = create_from_sfid(vmg_ sfid, buf, strlen(buf));
    }
    else if (argc == 2
             && (path = get_local_path(vmg_ G_stk->get(0))) != 0
             && (file = get_local_path(vmg_ G_stk->get(1))) != 0)
    {
        /* create a FileName from the combination of the two path strings */
        id = combine_path(vmg_ path + VMB_LEN, vmb_get_len(path),
                          file + VMB_LEN, vmb_get_len(file), FALSE);
    }
    else if (argc >= 3)
    {
        /* invalid number of arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }
    else
    {
        /* wrong types */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}